

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O1

bool __thiscall
helics::NetworkCommsInterface::PortAllocator::isPortUsed
          (PortAllocator *this,string_view host,int port)

{
  const_iterator cVar1;
  _Base_ptr *pp_Var2;
  _Base_ptr *pp_Var3;
  _Base_ptr *pp_Var4;
  bool bVar5;
  key_type local_20;
  
  local_20._M_str = host._M_str;
  local_20._M_len = host._M_len;
  cVar1 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::find(&(this->usedPort)._M_t,&local_20);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->usedPort)._M_t._M_impl.super__Rb_tree_header) {
    bVar5 = false;
  }
  else {
    pp_Var2 = &cVar1._M_node[1]._M_right;
    pp_Var3 = pp_Var2;
    for (pp_Var4 = *(_Base_ptr **)(cVar1._M_node + 2); pp_Var4 != (_Base_ptr *)0x0;
        pp_Var4 = (_Base_ptr *)pp_Var4[(ulong)(*(int *)(pp_Var4 + 4) < port) + 2]) {
      if (port <= *(int *)(pp_Var4 + 4)) {
        pp_Var3 = pp_Var4;
      }
    }
    pp_Var4 = pp_Var2;
    if ((pp_Var3 != pp_Var2) && (pp_Var4 = pp_Var3, port < *(int *)(pp_Var3 + 4))) {
      pp_Var4 = pp_Var2;
    }
    bVar5 = pp_Var4 != pp_Var2;
  }
  return bVar5;
}

Assistant:

bool NetworkCommsInterface::PortAllocator::isPortUsed(std::string_view host, int port) const
{
    auto fnd = usedPort.find(host);
    if (fnd == usedPort.end()) {
        return false;
    }
    return (fnd->second.count(port) != 0);
}